

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall embree::SceneGraph::HairSetNode::convert_bezier_to_hermite(HairSetNode *this)

{
  undefined8 uVar1;
  ulong uVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  Vec3fx *pVVar6;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  *this_00;
  unsigned_long *puVar7;
  Vec3fx *pVVar8;
  reference pvVar9;
  Vec3fx *pVVar10;
  long in_RDI;
  size_t i_11;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  pt;
  size_t i;
  size_t i_10;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  Vec3fx *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_9;
  size_t i_8;
  Vec3fx *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffffcc8;
  size_t in_stack_fffffffffffffcd0;
  ulong uVar11;
  Vec3fx *in_stack_fffffffffffffcd8;
  size_type in_stack_fffffffffffffce8;
  undefined1 *puVar12;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *in_stack_fffffffffffffcf0;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  *ppVar13;
  value_type local_298;
  ulong local_290;
  undefined1 local_278 [8];
  ulong local_270;
  undefined1 auStack_258 [32];
  ulong local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  ulong local_210;
  undefined1 *local_208;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  *local_200;
  ulong local_1f8;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  *local_1f0;
  undefined8 *local_1e8;
  Vec3fx *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  ulong local_1c8;
  undefined1 *local_1c0;
  reference local_1b8;
  reference local_1a8;
  undefined8 *local_1a0;
  Vec3fx *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  undefined8 *local_178;
  ulong local_170;
  ulong local_168;
  Vec3fx *local_160;
  ulong local_158;
  ulong local_150;
  size_t local_148;
  ulong local_140;
  reference local_138;
  size_t local_130;
  reference in_stack_fffffffffffffed8;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *in_stack_fffffffffffffee0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d0;
  ulong local_c8;
  unsigned_long local_60 [2];
  ulong local_50;
  ulong local_48;
  reference local_40;
  size_t local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
  *local_10;
  ulong local_8;
  
  if ((*(int *)(in_RDI + 0x70) == 0x18) || (*(int *)(in_RDI + 0x70) == 0x19)) {
    numTimeSteps((HairSetNode *)0x1d1d96);
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::resize(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    for (local_238 = 0; uVar11 = local_238,
        sVar4 = std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::size((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        *)(in_RDI + 0x78)), uVar11 < sVar4; local_238 = local_238 + 1) {
      std::
      vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
      ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    *)(in_RDI + 0x78),local_238);
      bezier_to_hermite_helper(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pvVar5 = std::
               vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                             *)(in_RDI + 0x78),local_238);
      uVar11 = local_270;
      local_140 = local_270;
      local_1c0 = local_278;
      local_1b8 = pvVar5;
      local_1a8 = pvVar5;
      local_40 = pvVar5;
      if (pvVar5->size_alloced < local_270) {
        sVar3 = local_140;
        if (pvVar5->size_alloced != 0) {
          local_50 = pvVar5->size_alloced;
          local_48 = local_140;
          while (local_50 < local_48) {
            local_60[1] = 1;
            local_60[0] = local_50 << 1;
            puVar7 = std::max<unsigned_long>(local_60 + 1,local_60);
            local_50 = *puVar7;
          }
          local_38 = local_50;
          sVar3 = local_38;
        }
      }
      else {
        sVar3 = pvVar5->size_alloced;
      }
      local_38 = sVar3;
      local_148 = local_38;
      uVar2 = local_140;
      if (uVar11 < pvVar5->size_active) {
        while (local_150 = uVar2, local_150 < pvVar5->size_active) {
          uVar2 = local_150 + 1;
        }
        pvVar5->size_active = uVar11;
      }
      local_138 = pvVar5;
      if (local_38 == pvVar5->size_alloced) {
        for (local_158 = pvVar5->size_active; local_158 < uVar11; local_158 = local_158 + 1) {
        }
        pvVar5->size_active = uVar11;
      }
      else {
        local_160 = pvVar5->items;
        local_130 = local_38;
        in_stack_fffffffffffffed8 = pvVar5;
        pVVar6 = (Vec3fx *)
                 alignedMalloc((size_t)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        pvVar5->items = pVVar6;
        for (local_168 = 0; local_168 < pvVar5->size_active; local_168 = local_168 + 1) {
          pVVar6 = pvVar5->items;
          in_stack_fffffffffffffee0 =
               (vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                *)(local_160 + local_168);
          uVar1 = *(undefined8 *)
                   ((long)&in_stack_fffffffffffffee0->
                           super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                   + 8);
          *(undefined8 *)&pVVar6[local_168].field_0 =
               *(undefined8 *)
                &in_stack_fffffffffffffee0->
                 super__Vector_base<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
          ;
          *(undefined8 *)((long)&pVVar6[local_168].field_0 + 8) = uVar1;
        }
        for (local_170 = pvVar5->size_active; local_170 < local_140; local_170 = local_170 + 1) {
        }
        alignedFree(in_stack_fffffffffffffcc8);
        pvVar5->size_active = local_140;
        pvVar5->size_alloced = local_148;
      }
      for (local_1c8 = 0; local_1c8 < pvVar5->size_active; local_1c8 = local_1c8 + 1) {
        local_190 = (undefined8 *)(*(long *)(local_1c0 + 0x18) + local_1c8 * 0x10);
        local_188 = &local_1d8;
        uStack_1d0 = local_190[1];
        local_1d8 = *local_190;
        local_198 = pvVar5->items + local_1c8;
        local_1a0 = &local_1d8;
        *(undefined8 *)&local_198->field_0 = *local_190;
        *(undefined8 *)((long)&local_198->field_0 + 8) = uStack_1d0;
      }
      puVar12 = auStack_258;
      this_00 = (pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
                 *)std::
                   vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                   ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                 *)(in_RDI + 0xa8),local_238);
      uVar11 = *(ulong *)(puVar12 + 8);
      ppVar13 = this_00;
      local_208 = puVar12;
      local_200 = this_00;
      local_1f8 = uVar11;
      local_1f0 = this_00;
      local_18 = uVar11;
      local_10 = this_00;
      if ((this_00->first).size_alloced < uVar11) {
        uVar2 = uVar11;
        if ((this_00->first).size_alloced != 0) {
          local_20 = (this_00->first).size_alloced;
          while (local_20 < local_18) {
            local_30[1] = 1;
            local_30[0] = local_20 << 1;
            puVar7 = std::max<unsigned_long>(local_30 + 1,local_30);
            local_20 = *puVar7;
          }
          local_8 = local_20;
          uVar2 = local_8;
        }
      }
      else {
        uVar2 = (this_00->first).size_alloced;
      }
      local_8 = uVar2;
      uVar2 = local_8;
      local_c8 = uVar11;
      if (uVar11 < (this_00->first).size_active) {
        for (; local_c8 < (this_00->first).size_active; local_c8 = local_c8 + 1) {
        }
        (this_00->first).size_active = uVar11;
      }
      if (local_8 == (this_00->first).size_alloced) {
        for (local_d0 = (this_00->first).size_active; local_d0 < uVar11; local_d0 = local_d0 + 1) {
        }
        (this_00->first).size_active = uVar11;
      }
      else {
        pVVar6 = (this_00->first).items;
        in_stack_fffffffffffffcd8 =
             (Vec3fx *)alignedMalloc((size_t)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
        (this_00->first).items = in_stack_fffffffffffffcd8;
        for (local_e0 = 0; local_e0 < (this_00->first).size_active; local_e0 = local_e0 + 1) {
          pVVar10 = (this_00->first).items + local_e0;
          pVVar8 = pVVar6 + local_e0;
          uVar1 = *(undefined8 *)((long)&pVVar8->field_0 + 8);
          *(undefined8 *)&pVVar10->field_0 = *(undefined8 *)&pVVar8->field_0;
          *(undefined8 *)((long)&pVVar10->field_0 + 8) = uVar1;
        }
        for (local_e8 = (this_00->first).size_active; local_e8 < uVar11; local_e8 = local_e8 + 1) {
        }
        alignedFree(in_stack_fffffffffffffcc8);
        (this_00->first).size_active = uVar11;
        (this_00->first).size_alloced = uVar2;
      }
      for (local_210 = 0; local_210 < (ppVar13->first).size_active; local_210 = local_210 + 1) {
        local_180 = (undefined8 *)(*(long *)(local_208 + 0x18) + local_210 * 0x10);
        local_178 = &local_228;
        uStack_220 = local_180[1];
        local_228 = *local_180;
        local_1e0 = (ppVar13->first).items + local_210;
        local_1e8 = &local_228;
        *(undefined8 *)&local_1e0->field_0 = *local_180;
        *(undefined8 *)((long)&local_1e0->field_0 + 8) = uStack_220;
      }
      std::
      pair<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>
      ::~pair(this_00);
    }
    local_290 = 0;
    while (uVar11 = local_290,
          sVar4 = std::
                  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                  ::size((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                          *)(in_RDI + 0xd8)), uVar11 < sVar4) {
      Hair::Hair(&local_298,(uint)(local_290 << 1),0);
      pvVar9 = std::
               vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
               ::operator[]((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
                             *)(in_RDI + 0xd8),local_290);
      *pvVar9 = local_298;
      local_290 = local_290 + 1;
    }
    if (*(int *)(in_RDI + 0x70) == 0x18) {
      *(undefined4 *)(in_RDI + 0x70) = 0x28;
    }
    else {
      *(undefined4 *)(in_RDI + 0x70) = 0x29;
    }
  }
  return;
}

Assistant:

void SceneGraph::HairSetNode::convert_bezier_to_hermite()
  {
    if (type != RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE &&
        type != RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE)
      return;

    tangents.resize(numTimeSteps());
    for (size_t i=0; i<positions.size(); i++) {
      auto pt = bezier_to_hermite_helper(hairs,positions[i]);
      positions[i] = pt.first;
      tangents[i] = pt.second;
    }
    for (size_t i=0; i<hairs.size(); i++) {
      hairs[i] = SceneGraph::HairSetNode::Hair(unsigned(2*i),0);
    }

    if (type == RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE)
      type = RTC_GEOMETRY_TYPE_ROUND_HERMITE_CURVE;
    else
      type = RTC_GEOMETRY_TYPE_FLAT_HERMITE_CURVE;
  }